

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void __thiscall re2::Compiler::AddSuffix(Compiler *this,int id)

{
  int iVar1;
  undefined4 in_ESI;
  long in_RDI;
  int alt;
  int in_stack_00000030;
  int in_stack_00000034;
  Compiler *in_stack_00000038;
  
  if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    if (*(int *)(in_RDI + 0x88) == 0) {
      *(undefined4 *)(in_RDI + 0x88) = in_ESI;
    }
    else if (*(int *)(in_RDI + 0x24) == 1) {
      iVar1 = AddSuffixRecursive(in_stack_00000038,in_stack_00000034,in_stack_00000030);
      *(int *)(in_RDI + 0x88) = iVar1;
    }
    else {
      iVar1 = AllocInst(in_stack_00000038,in_stack_00000034);
      if (iVar1 < 0) {
        *(undefined4 *)(in_RDI + 0x88) = 0;
      }
      else {
        PODArray<re2::Prog::Inst>::operator[]
                  ((PODArray<re2::Prog::Inst> *)CONCAT44(in_ESI,iVar1),(int)((ulong)in_RDI >> 0x20))
        ;
        Prog::Inst::InitAlt((Inst *)CONCAT44(in_ESI,iVar1),(uint32_t)((ulong)in_RDI >> 0x20),
                            (uint32_t)in_RDI);
        *(int *)(in_RDI + 0x88) = iVar1;
      }
    }
  }
  return;
}

Assistant:

void Compiler::AddSuffix(int id) {
  if (failed_)
    return;

  if (rune_range_.begin == 0) {
    rune_range_.begin = id;
    return;
  }

  if (encoding_ == kEncodingUTF8) {
    // Build a trie in order to reduce fanout.
    rune_range_.begin = AddSuffixRecursive(rune_range_.begin, id);
    return;
  }

  int alt = AllocInst(1);
  if (alt < 0) {
    rune_range_.begin = 0;
    return;
  }
  inst_[alt].InitAlt(rune_range_.begin, id);
  rune_range_.begin = alt;
}